

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::last
          (span<int,_18446744073709551615UL> *this,size_type count)

{
  ulong uVar1;
  span<int,_18446744073709551615UL> local_20;
  
  uVar1 = this->size_;
  if (uVar1 < count) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1198: Precondition violation."
              );
    uVar1 = this->size_;
  }
  span<int_*,_0>(&local_20,this->data_ + (uVar1 - count),count);
  return local_20;
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    last( size_type count ) const
    {
        span_EXPECTS( detail::is_positive( count ) && count <= size() );

        return span< element_type, dynamic_extent >( data() + ( size() - count ), count );
    }